

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall Food::Food(Food *this,Point *p)

{
  value_type local_30 [3];
  Point *local_18;
  Point *p_local;
  Food *this_local;
  
  local_18 = p;
  p_local = (Point *)this;
  Object::Object(&this->super_Object);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_move_0010ec30;
  (this->super_Object).ch = '%';
  Point::operator=(&(this->super_Object).position,local_18);
  local_30[0] = &this->super_Object;
  std::vector<Object_*,_std::allocator<Object_*>_>::push_back(&Object::obj,local_30);
  (this->super_Object).on_map = true;
  return;
}

Assistant:

Food::Food(const Point& p){
	ch = CHR_FOOD;
	position = p;
	obj.push_back(this);
	on_map = true;
}